

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O0

void pdqsort_detail::
     unguarded_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>,std::less<std::pair<double,int>>>
               (undefined8 param_1,undefined8 param_2)

{
  bool bVar1;
  reference ppVar2;
  __normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
  *this;
  T tmp;
  __normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
  sift_1;
  __normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
  sift;
  __normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
  cur;
  reference in_stack_ffffffffffffffa8;
  reference in_stack_ffffffffffffffb0;
  __normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
  in_stack_ffffffffffffffb8;
  pair<double,_int> local_40;
  __normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
  local_30;
  __normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
  local_28;
  __normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
  local_20 [2];
  undefined8 local_10;
  undefined8 local_8;
  
  local_10 = param_2;
  local_8 = param_1;
  bVar1 = __gnu_cxx::operator==
                    ((__normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
                      *)in_stack_ffffffffffffffb0,
                     (__normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
                      *)in_stack_ffffffffffffffa8);
  if (!bVar1) {
    local_20[0] = __gnu_cxx::
                  __normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
                  ::operator+(in_stack_ffffffffffffffb8._M_current,
                              (difference_type)in_stack_ffffffffffffffb0);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
                               *)in_stack_ffffffffffffffb0,
                              (__normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
                               *)in_stack_ffffffffffffffa8), bVar1) {
      local_28._M_current = local_20[0]._M_current;
      local_30 = __gnu_cxx::
                 __normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
                 ::operator-(in_stack_ffffffffffffffb8._M_current,
                             (difference_type)in_stack_ffffffffffffffb0);
      in_stack_ffffffffffffffb0 =
           __gnu_cxx::
           __normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
           ::operator*(&local_28);
      __gnu_cxx::
      __normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
      ::operator*(&local_30);
      bVar1 = std::less<std::pair<double,_int>_>::operator()
                        ((less<std::pair<double,_int>_> *)in_stack_ffffffffffffffb0,
                         in_stack_ffffffffffffffa8,(pair<double,_int> *)0x79c06d);
      if (bVar1) {
        ppVar2 = __gnu_cxx::
                 __normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
                 ::operator*(&local_28);
        local_40.first = ppVar2->first;
        local_40.second = ppVar2->second;
        local_40._12_4_ = *(undefined4 *)&ppVar2->field_0xc;
        do {
          in_stack_ffffffffffffffa8 =
               __gnu_cxx::
               __normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
               ::operator*(&local_30);
          in_stack_ffffffffffffffb8 =
               __gnu_cxx::
               __normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
               ::operator--(in_stack_ffffffffffffffb8._M_current,
                            (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
          ppVar2 = __gnu_cxx::
                   __normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
                   ::operator*((__normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
                                *)&stack0xffffffffffffffb8);
          std::pair<double,_int>::operator=(ppVar2,in_stack_ffffffffffffffa8);
          this = __gnu_cxx::
                 __normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
                 ::operator--(&local_30);
          __gnu_cxx::
          __normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
          ::operator*(this);
          bVar1 = std::less<std::pair<double,_int>_>::operator()
                            ((less<std::pair<double,_int>_> *)in_stack_ffffffffffffffb0,
                             in_stack_ffffffffffffffa8,(pair<double,_int> *)0x79c0ea);
        } while (bVar1);
        ppVar2 = __gnu_cxx::
                 __normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
                 ::operator*(&local_28);
        std::pair<double,_int>::operator=(ppVar2,&local_40);
      }
      __gnu_cxx::
      __normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
      ::operator++(local_20);
    }
  }
  return;
}

Assistant:

inline void unguarded_insertion_sort(Iter begin, Iter end, Compare comp) {
        typedef typename std::iterator_traits<Iter>::value_type T;
        if (begin == end) return;

        for (Iter cur = begin + 1; cur != end; ++cur) {
            Iter sift = cur;
            Iter sift_1 = cur - 1;

            // Compare first so we can avoid 2 moves for an element already positioned correctly.
            if (comp(*sift, *sift_1)) {
                T tmp = PDQSORT_PREFER_MOVE(*sift);

                do { *sift-- = PDQSORT_PREFER_MOVE(*sift_1); }
                while (comp(tmp, *--sift_1));

                *sift = PDQSORT_PREFER_MOVE(tmp);
            }
        }
    }